

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Uri.h
# Opt level: O1

void __thiscall
Uri::Uri::Uri(Uri *this,string *scheme,string *authority,string *path,string *query,string *fragment
             )

{
  pointer pcVar1;
  
  (this->raw)._M_dataplus._M_p = (pointer)&(this->raw).field_2;
  (this->raw)._M_string_length = 0;
  (this->raw).field_2._M_local_buf[0] = '\0';
  (this->scheme)._M_dataplus._M_p = (pointer)&(this->scheme).field_2;
  pcVar1 = (scheme->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->scheme,pcVar1,pcVar1 + scheme->_M_string_length);
  (this->authority)._M_dataplus._M_p = (pointer)&(this->authority).field_2;
  pcVar1 = (authority->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->authority,pcVar1,pcVar1 + authority->_M_string_length);
  (this->path)._M_dataplus._M_p = (pointer)&(this->path).field_2;
  pcVar1 = (path->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->path,pcVar1,pcVar1 + path->_M_string_length);
  (this->query)._M_dataplus._M_p = (pointer)&(this->query).field_2;
  pcVar1 = (query->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->query,pcVar1,pcVar1 + query->_M_string_length);
  (this->fragment)._M_dataplus._M_p = (pointer)&(this->fragment).field_2;
  pcVar1 = (fragment->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->fragment,pcVar1,pcVar1 + fragment->_M_string_length);
  return;
}

Assistant:

Uri (string &scheme, string &authority, string &path, string &query, string &fragment)
            : scheme(scheme), authority(authority), path(path), query(query), fragment(fragment) {}